

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_gtar_sparse_skip_entry.c
# Opt level: O0

void test_read_format_gtar_sparse_skip_entry(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  la_int64_t lVar4;
  longlong local_38;
  int64_t o;
  size_t s;
  void *p;
  archive_entry *ae;
  archive *a;
  char *refname;
  
  a = (archive *)anon_var_dwarf_237b3;
  copy_reference_file("test_read_format_gtar_sparse_skip_entry.tar.Z.uu");
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                   ,L'-',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'.',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
  iVar1 = archive_read_support_format_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'/',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
  wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'1',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",ae);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'4',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  pcVar3 = archive_entry_pathname((archive_entry *)p);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
             ,L'5',"a","\"a\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar4 = archive_entry_size((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'6',0x280000004,"LITERAL_LL(10737418244)",lVar4,"archive_entry_size(ae)",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'7',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'9',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'<',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  pcVar3 = archive_entry_pathname((archive_entry *)p);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
             ,L'=',"b","\"b\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar4 = archive_entry_size((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'>',4,"4",lVar4,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'?',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'A',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'E',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  iVar1 = archive_filter_code((archive *)ae,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'H',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",ae);
  iVar1 = archive_format((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'J',0x30002,"ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(long)iVar1,
                      "archive_format(a)",ae);
  iVar1 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'M',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'N',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  ae = (archive_entry *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                   ,L'T',(uint)(ae != (archive_entry *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'U',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",ae);
  iVar1 = archive_read_support_format_all((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'V',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",ae);
  wVar2 = archive_read_open_filename((archive_conflict *)ae,(char *)a,0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'X',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",ae);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  pcVar3 = archive_entry_pathname((archive_entry *)p);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
             ,L'\\',"a","\"a\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar4 = archive_entry_size((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L']',0x280000004,"LITERAL_LL(10737418244)",lVar4,"archive_entry_size(ae)",
                      (void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'^',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'`',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
  iVar1 = archive_read_data_block((archive *)ae,(void **)&s,(size_t *)&o,&local_38);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'a',0,"0",(long)iVar1,"archive_read_data_block(a, &p, &s, &o)",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'b',0x1000,"4096",o,"s",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'c',0,"0",local_38,"o",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'g',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  pcVar3 = archive_entry_pathname((archive_entry *)p);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
             ,L'h',"b","\"b\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  lVar4 = archive_entry_size((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'i',4,"4",lVar4,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted((archive_entry *)p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'j',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'l',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",ae);
  iVar1 = archive_read_next_header((archive *)ae,(archive_entry **)&p);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'p',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",ae);
  iVar1 = archive_filter_code((archive *)ae,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L's',3,"ARCHIVE_FILTER_COMPRESS",(long)iVar1,"archive_filter_code(a, 0)",ae);
  iVar1 = archive_format((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'u',0x30002,"ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(long)iVar1,
                      "archive_format(a)",ae);
  iVar1 = archive_read_close((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'x',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_read_free((archive *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_gtar_sparse_skip_entry.c"
                      ,L'y',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_gtar_sparse_skip_entry)
{
	const char *refname = "test_read_format_gtar_sparse_skip_entry.tar.Z.uu";
	struct archive *a;
	struct archive_entry *ae;
	const void *p;
	size_t s;
	int64_t o;

	copy_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("a", archive_entry_pathname(ae));
	assertEqualInt(LITERAL_LL(10737418244), archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a),
	    ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Verify regular second file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("b", archive_entry_pathname(ae));
	assertEqualInt(4, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a),
	    ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_COMPRESS, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE,
	    archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));


	/*
	 * Read just one block of a sparse file and skip it.
	 */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular first file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("a", archive_entry_pathname(ae));
	assertEqualInt(LITERAL_LL(10737418244), archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a),
	    ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);
	assertEqualInt(0, archive_read_data_block(a, &p, &s, &o));
	assertEqualInt(4096, s);
	assertEqualInt(0, o);


	/* Verify regular second file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString("b", archive_entry_pathname(ae));
	assertEqualInt(4, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a),
	    ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_COMPRESS, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE,
	    archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}